

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

void __thiscall cmCTestGIT::CommitParser::NextSection(CommitParser *this)

{
  cmCTestGIT *pcVar1;
  Revision local_110;
  CommitParser *local_10;
  CommitParser *this_local;
  
  this->Section = (int)(this->Section + SectionBody) % 3;
  (this->super_DiffParser).super_LineParser.Separator = "\n\n"[this->Section];
  if (this->Section == SectionHeader) {
    pcVar1 = (this->super_DiffParser).GIT;
    local_10 = this;
    (*(pcVar1->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])
              (pcVar1,&this->Rev,&(this->super_DiffParser).Changes);
    memset(&local_110,0,0x100);
    cmCTestVC::Revision::Revision(&local_110);
    cmCTestVC::Revision::operator=(&this->Rev,&local_110);
    cmCTestVC::Revision::~Revision(&local_110);
    DiffParser::DiffReset(&this->super_DiffParser);
  }
  return;
}

Assistant:

void NextSection()
  {
    this->Section =
      static_cast<SectionType>((this->Section + 1) % SectionCount);
    this->Separator = SectionSep[this->Section];
    if (this->Section == SectionHeader) {
      this->GIT->DoRevision(this->Rev, this->Changes);
      this->Rev = Revision();
      this->DiffReset();
    }
  }